

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeSorterReset(sqlite3 *db,VdbeSorter *pSorter)

{
  byte bVar1;
  UnpackedRecord *p;
  u8 *p_00;
  sqlite3_file *psVar2;
  SorterRecord *pSVar3;
  SorterRecord *pSVar4;
  ulong uVar5;
  SortSubtask *pSVar6;
  
  bVar1 = pSorter->nTask;
  if ((ulong)bVar1 != 0) {
    uVar5 = (ulong)bVar1 + 1;
    pSVar6 = (SortSubtask *)
             ((long)&((VdbeSorter *)(pSorter->aTask + -1))->mnPmaSize + (ulong)((uint)bVar1 * 0x60))
    ;
    do {
      vdbeSorterJoinThread(pSVar6);
      uVar5 = uVar5 - 1;
      pSVar6 = pSVar6 + -1;
    } while (1 < uVar5);
  }
  if (pSorter->pReader != (PmaReader *)0x0) {
    vdbePmaReaderClear(pSorter->pReader);
    if (pSorter->pReader != (PmaReader *)0x0) {
      sqlite3DbFreeNN(db,pSorter->pReader);
    }
    pSorter->pReader = (PmaReader *)0x0;
  }
  vdbeMergeEngineFree(pSorter->pMerger);
  pSorter->pMerger = (MergeEngine *)0x0;
  if (pSorter->nTask != '\0') {
    uVar5 = 0;
    do {
      p = pSorter->aTask[uVar5].pUnpacked;
      if (p != (UnpackedRecord *)0x0) {
        sqlite3DbFreeNN(db,p);
      }
      pSVar6 = pSorter->aTask + uVar5;
      p_00 = (pSVar6->list).aMemory;
      if (p_00 == (u8 *)0x0) {
        pSVar4 = (pSVar6->list).pList;
        while (pSVar4 != (SorterRecord *)0x0) {
          pSVar3 = (pSVar4->u).pNext;
          sqlite3_free(pSVar4);
          pSVar4 = pSVar3;
        }
      }
      else {
        sqlite3_free(p_00);
      }
      psVar2 = (pSVar6->file).pFd;
      if (psVar2 != (sqlite3_file *)0x0) {
        if (psVar2->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar2->pMethods->xClose)(psVar2);
          psVar2->pMethods = (sqlite3_io_methods *)0x0;
        }
        sqlite3_free(psVar2);
      }
      psVar2 = (pSVar6->file2).pFd;
      if (psVar2 != (sqlite3_file *)0x0) {
        if (psVar2->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar2->pMethods->xClose)(psVar2);
          psVar2->pMethods = (sqlite3_io_methods *)0x0;
        }
        sqlite3_free(psVar2);
      }
      pSVar6->pSorter = (VdbeSorter *)0x0;
      pSVar6->pUnpacked = (UnpackedRecord *)0x0;
      (pSVar6->file2).pFd = (sqlite3_file *)0x0;
      (pSVar6->file2).iEof = 0;
      (pSVar6->file).pFd = (sqlite3_file *)0x0;
      (pSVar6->file).iEof = 0;
      (pSVar6->list).szPMA = 0;
      pSVar6->xCompare = (SorterCompare)0x0;
      (pSVar6->list).pList = (SorterRecord *)0x0;
      (pSVar6->list).aMemory = (u8 *)0x0;
      pSVar6->pThread = (SQLiteThread *)0x0;
      pSVar6->bDone = 0;
      pSVar6->nPMA = 0;
      pSVar6->pSorter = pSorter;
      uVar5 = uVar5 + 1;
    } while (uVar5 < pSorter->nTask);
  }
  if ((pSorter->list).aMemory == (u8 *)0x0) {
    pSVar4 = (pSorter->list).pList;
    while (pSVar4 != (SorterRecord *)0x0) {
      pSVar3 = (pSVar4->u).pNext;
      sqlite3_free(pSVar4);
      pSVar4 = pSVar3;
    }
  }
  (pSorter->list).pList = (SorterRecord *)0x0;
  (pSorter->list).szPMA = 0;
  pSorter->bUsePMA = '\0';
  pSorter->iMemory = 0;
  pSorter->mxKeysize = 0;
  if (pSorter->pUnpacked != (UnpackedRecord *)0x0) {
    sqlite3DbFreeNN(db,pSorter->pUnpacked);
  }
  pSorter->pUnpacked = (UnpackedRecord *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSorterReset(sqlite3 *db, VdbeSorter *pSorter){
  int i;
  (void)vdbeSorterJoinAll(pSorter, SQLITE_OK);
  assert( pSorter->bUseThreads || pSorter->pReader==0 );
#if SQLITE_MAX_WORKER_THREADS>0
  if( pSorter->pReader ){
    vdbePmaReaderClear(pSorter->pReader);
    sqlite3DbFree(db, pSorter->pReader);
    pSorter->pReader = 0;
  }
#endif
  vdbeMergeEngineFree(pSorter->pMerger);
  pSorter->pMerger = 0;
  for(i=0; i<pSorter->nTask; i++){
    SortSubtask *pTask = &pSorter->aTask[i];
    vdbeSortSubtaskCleanup(db, pTask);
    pTask->pSorter = pSorter;
  }
  if( pSorter->list.aMemory==0 ){
    vdbeSorterRecordFree(0, pSorter->list.pList);
  }
  pSorter->list.pList = 0;
  pSorter->list.szPMA = 0;
  pSorter->bUsePMA = 0;
  pSorter->iMemory = 0;
  pSorter->mxKeysize = 0;
  sqlite3DbFree(db, pSorter->pUnpacked);
  pSorter->pUnpacked = 0;
}